

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableModel::itemChanged(QTableModel *this,QTableWidgetItem *item,QList<int> *roles)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  long in_RSI;
  QTableWidgetItem **in_RDI;
  long in_FS_OFFSET;
  int column;
  int row;
  QModelIndex idx;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 local_28 [16];
  QTableWidgetItem *local_18;
  QTableWidgetItem **local_8;
  
  local_8 = *(QTableWidgetItem ***)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0) {
    if ((*(byte *)(*(long *)(in_RSI + 0x30) + 0xc) & 1) == 0) {
      local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = (QTableWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
      index((QTableModel *)local_28,(char *)in_RDI,(int)in_RSI);
      bVar1 = QModelIndex::isValid
                        ((QModelIndex *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if (bVar1) {
        QAbstractItemModel::dataChanged
                  ((QModelIndex *)in_RDI,(QModelIndex *)local_28,(QList_conflict2 *)local_28);
      }
    }
    else {
      qVar3 = QListSpecialMethodsBase<QTableWidgetItem*>::indexOf<QTableWidgetItem*>
                        ((QListSpecialMethodsBase<QTableWidgetItem_*> *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI,
                         0x8d6550);
      iVar2 = (int)qVar3;
      if (iVar2 < 0) {
        qVar3 = QListSpecialMethodsBase<QTableWidgetItem*>::indexOf<QTableWidgetItem*>
                          ((QListSpecialMethodsBase<QTableWidgetItem_*> *)
                           CONCAT44(iVar2,in_stack_ffffffffffffffc0),in_RDI,0x8d6589);
        if (-1 < (int)qVar3) {
          QAbstractItemModel::headerDataChanged((Orientation)in_RDI,1,(int)qVar3);
        }
      }
      else {
        QAbstractItemModel::headerDataChanged((Orientation)in_RDI,2,iVar2);
      }
    }
  }
  if (*(QTableWidgetItem ***)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableModel::itemChanged(QTableWidgetItem *item, const QList<int> &roles)
{
    if (!item)
        return;
    if (item->d->headerItem) {
        int row = verticalHeaderItems.indexOf(item);
        if (row >= 0) {
            emit headerDataChanged(Qt::Vertical, row, row);
        } else {
            int column = horizontalHeaderItems.indexOf(item);
            if (column >= 0)
                emit headerDataChanged(Qt::Horizontal, column, column);
        }
    } else {
        QModelIndex idx = index(item);
        if (idx.isValid())
            emit dataChanged(idx, idx, roles);
    }
}